

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O1

int Abc_NtkDontCareWinAddMissing_rec(Odc_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  int iVar6;
  void **ppvVar7;
  int in_EDX;
  int Fill;
  int Fill_00;
  long lVar8;
  
  pAVar2 = pObj->pNtk;
  iVar6 = pObj->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,in_EDX);
  if ((-1 < (long)iVar6) && (iVar6 < (pAVar2->vTravIds).nSize)) {
    pAVar3 = pObj->pNtk;
    if ((pAVar2->vTravIds).pArray[iVar6] == pAVar3->nTravIds) {
      return 1;
    }
    iVar6 = pObj->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,Fill);
    if ((-1 < (long)iVar6) && (iVar6 < (pAVar3->vTravIds).nSize)) {
      pAVar2 = pObj->pNtk;
      iVar1 = pAVar2->nTravIds;
      if ((((pAVar3->vTravIds).pArray[iVar6] == iVar1 + -1) &&
          (uVar5 = *(uint *)&pObj->field_0x14 & 0xf, uVar5 != 2)) && (uVar5 != 5)) {
        if ((pObj->vFanins).nSize < 1) {
          return 1;
        }
        lVar8 = 0;
        do {
          iVar6 = Abc_NtkDontCareWinAddMissing_rec
                            (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar8]]
                            );
          if (iVar6 == 0) {
            return 0;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (pObj->vFanins).nSize);
        return 1;
      }
      iVar6 = pObj->Id;
      Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,Fill_00);
      if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar2->vTravIds).pArray[iVar6] = iVar1;
      pVVar4 = p->vBranches;
      uVar5 = pVVar4->nCap;
      if (pVVar4->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar7;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar5 * 2;
          if (iVar6 <= (int)uVar5) goto LAB_002785de;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar4->pArray,(ulong)uVar5 << 4);
          }
          pVVar4->pArray = ppvVar7;
        }
        pVVar4->nCap = iVar6;
      }
LAB_002785de:
      iVar6 = pVVar4->nSize;
      pVVar4->nSize = iVar6 + 1;
      pVVar4->pArray[iVar6] = pObj;
      return (uint)(p->vBranches->nSize < 0x21);
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_NtkDontCareWinAddMissing_rec( Odc_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip the already collected leaves and branches
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 1;
    // if this is not an internal node - make it a new branch
    if ( !Abc_NodeIsTravIdPrevious(pObj) || Abc_ObjIsCi(pObj) ) //|| (int)pObj->Level <= p->nLevLeaves )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        Vec_PtrPush( p->vBranches, pObj );
        return Vec_PtrSize(p->vBranches) <= 32;
    }
    // visit the fanins of the node
    Abc_ObjForEachFanin( pObj, pFanin, i )
        if ( !Abc_NtkDontCareWinAddMissing_rec( p, pFanin ) )
            return 0;
    return 1;
}